

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockComparatorCopierTest.cpp
# Opt level: O2

void __thiscall
TEST_MockComparatorCopierTest_installComparatorWorksHierarchicalOnBothExistingAndDynamicallyCreatedMockSupports_TestShell
::
~TEST_MockComparatorCopierTest_installComparatorWorksHierarchicalOnBothExistingAndDynamicallyCreatedMockSupports_TestShell
          (TEST_MockComparatorCopierTest_installComparatorWorksHierarchicalOnBothExistingAndDynamicallyCreatedMockSupports_TestShell
           *this)

{
  ExecFunctionTestShell::~ExecFunctionTestShell((ExecFunctionTestShell *)this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MockComparatorCopierTest, installComparatorWorksHierarchicalOnBothExistingAndDynamicallyCreatedMockSupports)
{
    MyTypeForTesting object(1);
    MyTypeForTestingComparator comparator;

    mock("existing");
    mock().installComparator("MyTypeForTesting", comparator);
    mock("existing").expectOneCall("function").withParameterOfType("MyTypeForTesting", "parameterName", &object);
    mock("existing").actualCall("function").withParameterOfType("MyTypeForTesting", "parameterName", &object);
    mock("dynamic").expectOneCall("function").withParameterOfType("MyTypeForTesting", "parameterName", &object);
    mock("dynamic").actualCall("function").withParameterOfType("MyTypeForTesting", "parameterName", &object);

    mock().checkExpectations();
    mock().removeAllComparatorsAndCopiers();
}